

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

int Abc_NodeDecomposeStep(Abc_ManScl_t *p)

{
  char cVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  uint *puVar3;
  uint *pOut;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 *puVar7;
  Abc_Obj_t **pLeaves;
  void *pvVar8;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin_00;
  char *pcVar9;
  uint local_a4;
  int nCofs;
  int nClasses;
  int nVarsNew;
  int nVars;
  int w;
  int v;
  int c;
  int k;
  int i;
  uint uPhase;
  uint *pTruth;
  uint *pTruthClass;
  uint *pTruthCof;
  Abc_Obj_t *pNodesNew [6];
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObjNew;
  Abc_Ntk_t *pNtk;
  Abc_ManScl_t *p_local;
  
  puVar7 = (undefined8 *)Vec_PtrEntry(p->vLeaves,0);
  pNtk_00 = (Abc_Ntk_t *)*puVar7;
  iVar4 = Vec_PtrSize(p->vLeaves);
  if (iVar4 <= p->nLutSize) {
    __assert_fail("nVars > p->nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x2a5,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
  }
  pLeaves = (Abc_Obj_t **)Vec_PtrArray(p->vLeaves);
  iVar5 = Vec_PtrSize(p->vLeaves);
  Abc_NodeDecomposeSort(pLeaves,iVar5,p->pBSet,p->nLutSize);
  pvVar8 = Vec_PtrEntry(p->vLeaves,p->pBSet[0]);
  uVar2 = *(uint *)((long)pvVar8 + 0x14);
  pvVar8 = Vec_PtrEntry(p->vLeaves,p->pBSet[1]);
  if (*(uint *)((long)pvVar8 + 0x14) >> 0xc < uVar2 >> 0xc) {
    __assert_fail("((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[0]))->Level <= ((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[1]))->Level"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x2ae,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
  }
  Extra_TruthCopy(p->uCofs[1],p->uTruth,iVar4);
  w = 2;
  for (nVars = 0; nVars < p->nLutSize; nVars = nVars + 1) {
    for (v = 0; v < 1 << ((byte)nVars & 0x1f); v = v + 1) {
      Extra_TruthCopy(p->uCofs[w],p->uCofs[w / 2],iVar4);
      Extra_TruthCopy(p->uCofs[w + 1],p->uCofs[w / 2],iVar4);
      Extra_TruthCofactor0(p->uCofs[w],iVar4,p->pBSet[nVars]);
      Extra_TruthCofactor1(p->uCofs[w + 1],iVar4,p->pBSet[nVars]);
      w = w + 2;
    }
  }
  if (w != 2 << ((byte)p->nLutSize & 0x1f)) {
    __assert_fail("c == (2 << p->nLutSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,699,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
  }
  local_a4 = 0;
  iVar5 = 1 << ((byte)p->nLutSize & 0x1f);
  c = 0;
  do {
    if (iVar5 <= c) {
      iVar6 = Abc_Base2Log(local_a4);
      if (p->nLutSize <= iVar6) {
        __assert_fail("nVarsNew < p->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                      ,0x2d6,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
      }
      Extra_TruthClear(p->uTruth,iVar4);
      for (v = 0; v < (int)local_a4; v = v + 1) {
        puVar3 = p->uCofs[iVar5 + Abc_NodeDecomposeStep::pCofClasses[v][0]];
        for (nVars = 0; nVars < iVar6; nVars = nVars + 1) {
          if ((v & 1 << ((byte)nVars & 0x1f)) == 0) {
            Extra_TruthSharp(puVar3,puVar3,p->uVars[p->pBSet[nVars]],iVar4);
          }
          else {
            Extra_TruthAnd(puVar3,puVar3,p->uVars[p->pBSet[nVars]],iVar4);
          }
        }
        Extra_TruthOr(p->uTruth,p->uTruth,puVar3,iVar4);
      }
      puVar3 = *p->uCofs;
      for (nVars = 0; nVars < iVar6; nVars = nVars + 1) {
        Extra_TruthClear(puVar3,p->nLutSize);
        for (v = 0; v < (int)local_a4; v = v + 1) {
          if ((v & 1 << ((byte)nVars & 0x1f)) != 0) {
            for (c = 0; c < Abc_NodeDecomposeStep::nCofClasses[v]; c = c + 1) {
              pOut = p->uCofs[1];
              Extra_TruthFill(pOut,p->nLutSize);
              for (nVarsNew = 0; nVarsNew < p->nLutSize; nVarsNew = nVarsNew + 1) {
                if (((int)Abc_NodeDecomposeStep::pCofClasses[v][c] &
                    1 << (((char)p->nLutSize + -1) - (char)nVarsNew & 0x1fU)) == 0) {
                  Extra_TruthSharp(pOut,pOut,p->uVars[nVarsNew],p->nLutSize);
                }
                else {
                  Extra_TruthAnd(pOut,pOut,p->uVars[nVarsNew],p->nLutSize);
                }
              }
              Extra_TruthOr(puVar3,puVar3,pOut,p->nLutSize);
            }
          }
        }
        pObj = Abc_NtkCreateNode(pNtk_00);
        for (c = 0; c < p->nLutSize; c = c + 1) {
          pFanin_00 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,p->pBSet[c]);
          Abc_ObjAddFanin(pObj,pFanin_00);
        }
        pcVar9 = Abc_SopCreateFromTruth((Mem_Flex_t *)pNtk_00->pManFunc,p->nLutSize,puVar3);
        (pObj->field_5).pData = pcVar9;
        iVar5 = Abc_NodeGetLevel(pObj);
        *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | iVar5 << 0xc;
        pNodesNew[(long)nVars + -1] = pObj;
      }
      for (nVars = 0; nVars < iVar6; nVars = nVars + 1) {
        Vec_PtrWriteEntry(p->vLeaves,p->pBSet[nVars],pNodesNew[(long)nVars + -1]);
      }
      k = 0;
      for (nVars = iVar6; nVars < p->nLutSize; nVars = nVars + 1) {
        k = 1 << ((byte)p->pBSet[nVars] & 0x1f) | k;
      }
      Abc_NodeLeavesRemove(p->vLeaves,k,iVar4);
      Extra_TruthShrink(*p->uCofs,p->uTruth,(iVar4 - p->nLutSize) + iVar6,iVar4,
                        (1 << ((byte)iVar4 & 0x1f)) - 1U & (k ^ 0xffffffffU));
      Extra_TruthCopy(p->uTruth,*p->uCofs,iVar4);
      iVar4 = Extra_TruthVarInSupport(p->uTruth,iVar4,(iVar4 - p->nLutSize) + iVar6);
      if (iVar4 == 0) {
        return 1;
      }
      __assert_fail("!Extra_TruthVarInSupport( p->uTruth, nVars, nVars - p->nLutSize + nVarsNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                    ,0x30e,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
    }
    puVar3 = p->uCofs[iVar5 + c];
    for (v = 0; v < (int)local_a4; v = v + 1) {
      iVar6 = Extra_TruthIsEqual(puVar3,p->uCofs[iVar5 + Abc_NodeDecomposeStep::pCofClasses[v][0]],
                                 iVar4);
      if (iVar6 != 0) {
        cVar1 = Abc_NodeDecomposeStep::nCofClasses[v];
        Abc_NodeDecomposeStep::nCofClasses[v] = cVar1 + '\x01';
        Abc_NodeDecomposeStep::pCofClasses[v][(int)cVar1] = (char)c;
        break;
      }
    }
    if (v == local_a4) {
      Abc_NodeDecomposeStep::pCofClasses[(int)local_a4][0] = (char)c;
      Abc_NodeDecomposeStep::nCofClasses[(int)local_a4] = '\x01';
      local_a4 = local_a4 + 1;
      if (iVar5 / 2 < (int)local_a4) {
        return 0;
      }
    }
    c = c + 1;
  } while( true );
}

Assistant:

int Abc_NodeDecomposeStep( Abc_ManScl_t * p )
{
    static char pCofClasses[1<<SCL_LUT_MAX][1<<SCL_LUT_MAX];
    static char nCofClasses[1<<SCL_LUT_MAX];
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObjNew, * pFanin, * pNodesNew[SCL_LUT_MAX];
    unsigned * pTruthCof, * pTruthClass, * pTruth, uPhase;
    int i, k, c, v, w, nVars, nVarsNew, nClasses, nCofs;
    // set the network
    pNtk = ((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, 0))->pNtk;
    // find the earliest nodes
    nVars = Vec_PtrSize(p->vLeaves);
    assert( nVars > p->nLutSize );
/*
    for ( v = 0; v < nVars; v++ )
        p->pBSet[v] = v;
    qsort( (void *)p->pBSet, nVars, sizeof(int), 
            (int (*)(const void *, const void *)) Abc_NodeCompareLevelsInc );
*/
    Abc_NodeDecomposeSort( (Abc_Obj_t **)Vec_PtrArray(p->vLeaves), Vec_PtrSize(p->vLeaves), p->pBSet, p->nLutSize );
    assert( ((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[0]))->Level <=
        ((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[1]))->Level );
    // cofactor w.r.t. the selected variables
    Extra_TruthCopy( p->uCofs[1], p->uTruth, nVars );
    c = 2;
    for ( v = 0; v < p->nLutSize; v++ )
        for ( k = 0; k < (1<<v); k++ )
        {
            Extra_TruthCopy( p->uCofs[c], p->uCofs[c/2], nVars );
            Extra_TruthCopy( p->uCofs[c+1], p->uCofs[c/2], nVars );
            Extra_TruthCofactor0( p->uCofs[c], nVars, p->pBSet[v] );
            Extra_TruthCofactor1( p->uCofs[c+1], nVars, p->pBSet[v] );
            c += 2;
        }
    assert( c == (2 << p->nLutSize) );
    // count unique cofactors
    nClasses = 0;
    nCofs = (1 << p->nLutSize);
    for ( i = 0; i < nCofs; i++ )
    {
        pTruthCof = p->uCofs[ nCofs + i ];
        for ( k = 0; k < nClasses; k++ )
        {
            pTruthClass = p->uCofs[ nCofs + pCofClasses[k][0] ];
            if ( Extra_TruthIsEqual( pTruthCof, pTruthClass, nVars ) )
            {
                pCofClasses[k][(int)nCofClasses[k]++ ] = i;
                break;
            }
        }
        if ( k != nClasses )
            continue;
        // not found
        pCofClasses[nClasses][0] = i;
        nCofClasses[nClasses] = 1;
        nClasses++;
        if ( nClasses > nCofs/2 )
            return 0;
    }
    // the number of cofactors is acceptable
    nVarsNew = Abc_Base2Log( nClasses );
    assert( nVarsNew < p->nLutSize );
    // create the remainder truth table
    // for each class of cofactors, multiply cofactor truth table by its code
    Extra_TruthClear( p->uTruth, nVars );
    for ( k = 0; k < nClasses; k++ )
    {
        pTruthClass = p->uCofs[ nCofs + pCofClasses[k][0] ];
        for ( v = 0; v < nVarsNew; v++ )
            if ( k & (1 << v) )
                Extra_TruthAnd( pTruthClass, pTruthClass, p->uVars[p->pBSet[v]], nVars );
            else
                Extra_TruthSharp( pTruthClass, pTruthClass, p->uVars[p->pBSet[v]], nVars );
        Extra_TruthOr( p->uTruth, p->uTruth, pTruthClass, nVars );
    }
    // create nodes
    pTruth = p->uCofs[0];
    for ( v = 0; v < nVarsNew; v++ )
    {
        Extra_TruthClear( pTruth, p->nLutSize );
        for ( k = 0; k < nClasses; k++ )
            if ( k & (1 << v) )
                for ( i = 0; i < nCofClasses[k]; i++ )
                {
                    pTruthCof = p->uCofs[1];
                    Extra_TruthFill( pTruthCof, p->nLutSize );
                    for ( w = 0; w < p->nLutSize; w++ )
                        if ( pCofClasses[k][i] & (1 << (p->nLutSize-1-w)) )
                            Extra_TruthAnd( pTruthCof, pTruthCof, p->uVars[w], p->nLutSize );
                        else
                            Extra_TruthSharp( pTruthCof, pTruthCof, p->uVars[w], p->nLutSize );
                    Extra_TruthOr( pTruth, pTruth, pTruthCof, p->nLutSize );
                }
        // implement the node
        pObjNew = Abc_NtkCreateNode( pNtk );
        for ( i = 0; i < p->nLutSize; i++ )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( p->vLeaves, p->pBSet[i] );
            Abc_ObjAddFanin( pObjNew, pFanin );
        }
        // create the function
        pObjNew->pData = Abc_SopCreateFromTruth( (Mem_Flex_t *)pNtk->pManFunc, p->nLutSize, pTruth ); // need ISOP
        pObjNew->Level = Abc_NodeGetLevel( pObjNew );
        pNodesNew[v] = pObjNew;
    }
    // put the new nodes back into the list
    for ( v = 0; v < nVarsNew; v++ )
        Vec_PtrWriteEntry( p->vLeaves, p->pBSet[v], pNodesNew[v] );
    // compute the variables that should be removed
    uPhase = 0;
    for ( v = nVarsNew; v < p->nLutSize; v++ )
        uPhase |= (1 << p->pBSet[v]);
    // remove entries from the array
    Abc_NodeLeavesRemove( p->vLeaves, uPhase, nVars );
    // update truth table
    Extra_TruthShrink( p->uCofs[0], p->uTruth, nVars - p->nLutSize + nVarsNew, nVars, ((1 << nVars) - 1) & ~uPhase );
    Extra_TruthCopy( p->uTruth, p->uCofs[0], nVars );
    assert( !Extra_TruthVarInSupport( p->uTruth, nVars, nVars - p->nLutSize + nVarsNew ) );
    return 1;
}